

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

Complex __thiscall rtb::Filter::Polynomial<double>::solveFor(Polynomial<double> *this,Complex value)

{
  const_reference __x;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  Complex CVar3;
  complex<double> local_58;
  complex<double> local_48;
  uint local_34;
  Polynomial<double> *pPStack_30;
  uint i;
  Polynomial<double> *this_local;
  Complex value_local;
  Complex r;
  
  uVar2 = 0;
  pPStack_30 = this;
  std::complex<double>::complex((complex<double> *)(value_local._M_value + 8),0.0,0.0);
  uVar1 = extraout_RDX;
  for (local_34 = 0; CVar3._M_value._0_8_ = CONCAT44(0,local_34), CVar3._M_value._0_8_ < this->size_
      ; local_34 = local_34 + 1) {
    __x = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                    (&this->coefficients_,(ulong)local_34);
    std::pow<double,unsigned_int>((complex<double> *)&this_local,&local_34);
    local_58._M_value._8_8_ = uVar2;
    std::operator*(__x,&local_58);
    local_48._M_value._8_8_ = uVar2;
    std::complex<double>::operator+=((complex<double> *)(value_local._M_value + 8),&local_48);
    uVar1 = extraout_RDX_00;
  }
  CVar3._M_value._8_8_ = uVar1;
  return (Complex)CVar3._M_value;
}

Assistant:

typename Polynomial<T>::Complex Polynomial<T>::solveFor(Complex value) const {

            Complex r{ 0 };
            for (unsigned i{ 0 }; i < size_; ++i)
                r += coefficients_.at(i)*std::pow(value, i);
            return r;
        }